

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O0

mkroom * search_special(level *lev,schar type)

{
  mkroom *local_28;
  mkroom *croom;
  schar type_local;
  level *lev_local;
  
  local_28 = lev->rooms;
  while( true ) {
    if (local_28->hx < '\0') {
      local_28 = lev->subrooms;
      while( true ) {
        if (local_28->hx < '\0') {
          return (mkroom *)0x0;
        }
        if (((type == -1) && (local_28->rtype != '\0')) ||
           (((type == -2 && ('\x11' < local_28->rtype)) || (local_28->rtype == type)))) break;
        local_28 = local_28 + 1;
      }
      return local_28;
    }
    if ((((type == -1) && (local_28->rtype != '\0')) || ((type == -2 && ('\x11' < local_28->rtype)))
        ) || (local_28->rtype == type)) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

struct mkroom *search_special(struct level *lev, schar type)
{
	struct mkroom *croom;

	for (croom = &lev->rooms[0]; croom->hx >= 0; croom++)
	    if ((type == ANY_TYPE && croom->rtype != OROOM) ||
	       (type == ANY_SHOP && croom->rtype >= SHOPBASE) ||
	       croom->rtype == type)
		return croom;
	for (croom = &lev->subrooms[0]; croom->hx >= 0; croom++)
	    if ((type == ANY_TYPE && croom->rtype != OROOM) ||
	       (type == ANY_SHOP && croom->rtype >= SHOPBASE) ||
	       croom->rtype == type)
		return croom;
	return NULL;
}